

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  ulong local_48;
  size_t i_1;
  size_t i;
  int passed;
  undefined1 local_28 [8];
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  sources;
  
  sources.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  printf("===FAIL===\n\n");
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::vector((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
            *)local_28);
  populate_sources("test/fail%d.json",
                   (vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                    *)local_28);
  i._0_4_ = 0;
  for (i_1 = 0; sVar2 = std::
                        vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                        ::size((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                *)local_28), i_1 < sVar2; i_1 = i_1 + 1) {
    printf("Parsing %zd\n",i_1 + 1);
    pvVar3 = std::
             vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                           *)local_28,i_1);
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](pvVar3,0);
    bVar1 = parse(pvVar4);
    if (bVar1) {
      i._0_4_ = (uint)i + 1;
    }
  }
  sVar2 = std::
          vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
          ::size((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                  *)local_28);
  printf("Passed %d from %zd tests\n",(ulong)(uint)i,sVar2);
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::clear((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
           *)local_28);
  printf("\n===PASS===\n\n");
  populate_sources("test/pass%d.json",
                   (vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                    *)local_28);
  i._0_4_ = 0;
  for (local_48 = 0;
      sVar2 = std::
              vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
              ::size((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                      *)local_28), local_48 < sVar2; local_48 = local_48 + 1) {
    printf("Parsing %zd\n",local_48 + 1);
    pvVar3 = std::
             vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                           *)local_28,local_48);
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](pvVar3,0);
    bVar1 = parse(pvVar4);
    if (bVar1) {
      i._0_4_ = (uint)i + 1;
    }
  }
  sVar2 = std::
          vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
          ::size((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                  *)local_28);
  printf("Passed %d from %zd tests\n",(ulong)(uint)i,sVar2);
  sources.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::~vector((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             *)local_28);
  return sources.
         super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main()
{
	// Fail
	printf("===FAIL===\n\n");
	std::vector<std::vector<char> > sources;
	populate_sources("test/fail%d.json", sources);
	int passed = 0;
	for (size_t i = 0; i < sources.size(); ++i)
	{
		printf("Parsing %zd\n", i + 1);
		if (parse(&sources[i][0]))
		{
			++passed;
		}
	}
	printf("Passed %d from %zd tests\n", passed, sources.size());

	// Pass
	sources.clear();
	printf("\n===PASS===\n\n");
	populate_sources("test/pass%d.json", sources);
	passed = 0;
	for (size_t i = 0; i < sources.size(); ++i)
	{
		printf("Parsing %zd\n", i + 1);
		if (parse(&sources[i][0]))
		{
			++passed;
		}
	}
	printf("Passed %d from %zd tests\n", passed, sources.size());

	return 0;
}